

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall
kj::_::RaceSuccessfulPromiseNodeBase::get
          (RaceSuccessfulPromiseNodeBase *this,ExceptionOrValue *output)

{
  Exception *exception;
  
  if ((this->output->exception).ptr.isSet == true) {
    ExceptionOrValue::addException(output,&(this->output->exception).ptr.field_1.value);
    return;
  }
  (*(this->super_PromiseNode).super_PromiseArenaMember._vptr_PromiseArenaMember[5])();
  return;
}

Assistant:

void RaceSuccessfulPromiseNodeBase::get(ExceptionOrValue &output) noexcept {
  KJ_IF_SOME(exception, this->output.exception) {
    output.addException(kj::mv(exception));
  } else {
    getNoError(output);
  }
}